

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
AdminMsgIRCCommand::trigger
          (AdminMsgIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,nick._M_str,0x31,
               "Error: Too Few Parameters. Syntax: amsg <Message>");
    return;
  }
  Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  Jupiter::IRC::Client::Channel::getType();
  uVar5 = 0;
  bVar6 = false;
  while( true ) {
    RenX::getCore();
    uVar3 = RenX::Core::getServerCount();
    if (uVar3 == uVar5) break;
    uVar3 = RenX::getCore();
    uVar4 = RenX::Core::getServer(uVar3);
    cVar1 = RenX::Server::isLogChanType((int)uVar4);
    if (cVar1 != '\0') {
      iVar2 = RenX::Server::sendAdminMessage(uVar4,parameters._M_len,parameters._M_str);
      bVar6 = 0 < iVar2;
    }
    uVar5 = uVar5 + 1;
  }
  if (bVar6) {
    return;
  }
  Jupiter::IRC::Client::sendMessage
            (source,channel._M_len,channel._M_str,0x40,
             "Error: Channel not attached to any connected Renegade X servers.");
  return;
}

Assistant:

std::string_view MsgIRCCommand::getHelp(std::string_view )
{
	static constexpr std::string_view defaultHelp = "Sends a message in - game.Syntax: Msg <Message>"sv;
	return defaultHelp;
}